

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::rp_hsol_sol(HDual *this,HModel *ptr_model)

{
  HModel *pHVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  long lVar8;
  int c_n;
  ulong uVar9;
  
  pHVar1 = this->model;
  pdVar2 = (pHVar1->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (pHVar1->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (pHVar1->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pHVar1->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pHVar1->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (pHVar1->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puts(" Column      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd        Cost");
  for (uVar9 = 0; (long)uVar9 < (long)this->numCol; uVar9 = uVar9 + 1) {
    printf("%7d %11.4g %11.4g %7d %11.4g %11.4g %11.4g\n",this->workValue[uVar9],
           this->workDual[uVar9],pdVar3[uVar9],pdVar4[uVar9],pdVar2[uVar9],uVar9 & 0xffffffff,
           (ulong)(uint)piVar7[uVar9]);
  }
  puts("    Row      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd");
  for (uVar9 = 0; (long)uVar9 < (long)this->numRow; uVar9 = uVar9 + 1) {
    lVar8 = (long)this->numCol + uVar9;
    printf("%7d %11.4g %11.4g %7d %11.4g %11.4g\n",this->workValue[lVar8],this->workDual[lVar8],
           pdVar5[uVar9],pdVar6[uVar9],uVar9 & 0xffffffff,(ulong)(uint)piVar7[lVar8]);
  }
  return;
}

Assistant:

void HDual::rp_hsol_sol(HModel *ptr_model) {
	const double *colCost = model->getcolCost();
	const double *colLower = model->getcolLower();
	const double *colUpper = model->getcolUpper();
	const double *rowLower = model->getrowLower();
	const double *rowUpper = model->getrowUpper();
	const int *nonbasicFlag = model->getNonbasicFlag();
	printf(" Column      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd        Cost\n");
	for (int c_n = 0; c_n < numCol; c_n++) {
		int vr_n = c_n;
		printf("%7d %11.4g %11.4g %7d %11.4g %11.4g %11.4g\n", c_n, workValue[vr_n], workDual[vr_n], nonbasicFlag[vr_n], colLower[c_n], colUpper[c_n], colCost[c_n]);
	}
	printf("    Row      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd\n");
	for (int r_n = 0; r_n < numRow; r_n++) {
		int vr_n = numCol+r_n;
		printf("%7d %11.4g %11.4g %7d %11.4g %11.4g\n", r_n, workValue[vr_n], workDual[vr_n], nonbasicFlag[vr_n], rowLower[r_n], rowUpper[r_n]);
	}

}